

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_CallIExtended<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  uint offset;
  Var target;
  RecyclableObject *function;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *local_38;
  OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_short>
                     (this,(playout->super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                           ).Function);
  function = OP_CallGetFunc(this,target);
  if ((playout->Options & CallIExtended_SpreadArgs) == CallIExtended_None) {
    local_38 = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    offset = playout->SpreadAuxOffset;
    functionBody = GetFunctionBody(this);
    local_38 = ByteCodeReader::ReadAuxArray<unsigned_int>(offset,functionBody);
  }
  OP_CallCommon<Js::OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (this,playout,function,0,local_38);
  return;
}

Assistant:

void OP_CallIFlags(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), playout->callFlags); }